

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

string * format<std::__cxx11::string,std::__cxx11::string>
                   (string *__return_storage_ptr__,string *fmt,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)args);
  std::__cxx11::string::string((string *)&bStack_58,(string *)args_1);
  format<std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,1,fmt,&local_38,&bStack_58);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

const std::string format (const std::string& fmt, Args... args)
{
    return format (1, fmt, args...);
}